

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void ipc_on_connection_tcp_conn(uv_stream_t *server,int status)

{
  int iVar1;
  uint uVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar6;
  uv_pipe_t *puVar7;
  uv_loop_t *puVar8;
  uv_write_t *puVar9;
  uv_tcp_t *puVar10;
  ulong uVar11;
  undefined1 auStack_a8 [16];
  uv_pipe_t *puStack_98;
  undefined1 auStack_90 [16];
  undefined1 auStack_80 [16];
  uv_pipe_t *puStack_70;
  undefined1 auStack_60 [8];
  code *pcStack_58;
  uv_pipe_t *puStack_50;
  undefined1 local_18 [16];
  
  if (status == 0) {
    puVar9 = (uv_write_t *)server;
    if (server != (uv_stream_t *)&tcp_server) goto LAB_00162e28;
    puVar9 = (uv_write_t *)0xf8;
    puVar3 = (uv_loop_t *)malloc(0xf8);
    if (puVar3 == (uv_loop_t *)0x0) goto LAB_00162e2d;
    puVar8 = puVar3;
    puVar9 = (uv_write_t *)tcp_server.loop;
    iVar1 = uv_tcp_init();
    status = (int)puVar8;
    if (iVar1 != 0) goto LAB_00162e32;
    puVar10 = &tcp_server;
    puVar8 = puVar3;
    iVar1 = uv_accept();
    status = (int)puVar8;
    puVar9 = (uv_write_t *)puVar10;
    if (iVar1 != 0) goto LAB_00162e37;
    local_18 = uv_buf_init("hello\n",6);
    puVar9 = &conn_notify_req;
    status = 0x2e6b38;
    iVar1 = uv_write2(&conn_notify_req,&channel,local_18,1,puVar3,0);
    if (iVar1 != 0) goto LAB_00162e3c;
    status = 0x16357c;
    puVar9 = (uv_write_t *)puVar3;
    iVar1 = uv_read_start(puVar3,on_read_alloc,on_tcp_child_process_read);
    if (iVar1 == 0) {
      uv_close(puVar3,close_cb);
      return;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar9 = (uv_write_t *)server;
LAB_00162e28:
    ipc_on_connection_tcp_conn_cold_2();
LAB_00162e2d:
    ipc_on_connection_tcp_conn_cold_7();
LAB_00162e32:
    ipc_on_connection_tcp_conn_cold_3();
LAB_00162e37:
    ipc_on_connection_tcp_conn_cold_4();
LAB_00162e3c:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (status == 0) {
    iVar1 = uv_read_start(((uv_loop_t *)puVar9)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar4 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar4,&channel,1);
  if (iVar1 == 0) {
    puVar6 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00162f72;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00162f77;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00162f7c;
    uVar2 = write_until_data_queued();
    if (uVar2 != 0) {
      send_handle_and_close();
    }
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_00162f81;
    if (closed_handle_write == '\0') goto LAB_00162f86;
    puVar6 = (uv_pipe_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar6 = (uv_pipe_t *)buffer;
LAB_00162f72:
    ipc_helper_closed_handle_cold_2();
LAB_00162f77:
    ipc_helper_closed_handle_cold_3();
LAB_00162f7c:
    ipc_helper_closed_handle_cold_4();
LAB_00162f81:
    ipc_helper_closed_handle_cold_5();
LAB_00162f86:
    ipc_helper_closed_handle_cold_6();
  }
  ipc_helper_closed_handle_cold_7();
  uVar11 = 0;
  puVar7 = (uv_pipe_t *)write_reqs;
  puStack_50 = puVar6;
  while( true ) {
    pcStack_58 = (code *)0x162fce;
    iVar1 = uv_write(puVar7,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) break;
    if (0x12a < uVar11) {
      return;
    }
    uVar11 = uVar11 + 1;
    puVar7 = (uv_pipe_t *)puVar7->write_queue;
    if (channel.write_queue_size != 0) {
      return;
    }
  }
  pcStack_58 = send_handle_and_close;
  write_until_data_queued_cold_1();
  puStack_70 = (uv_pipe_t *)0x163009;
  uVar4 = uv_default_loop();
  puStack_70 = (uv_pipe_t *)0x163018;
  iVar1 = uv_tcp_init(uVar4,&tcp_server);
  if (iVar1 == 0) {
    puStack_70 = (uv_pipe_t *)0x163032;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_60);
    if (iVar1 != 0) goto LAB_00163096;
    puStack_70 = (uv_pipe_t *)0x163049;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_60,0);
    if (iVar1 != 0) goto LAB_0016309b;
    puStack_70 = (uv_pipe_t *)0x16307a;
    iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
    if (iVar1 == 0) {
      puStack_70 = (uv_pipe_t *)0x16308c;
      uv_close(&tcp_server,0);
      return;
    }
  }
  else {
    puStack_70 = (uv_pipe_t *)0x163096;
    send_handle_and_close_cold_1();
LAB_00163096:
    puStack_70 = (uv_pipe_t *)0x16309b;
    send_handle_and_close_cold_2();
LAB_0016309b:
    puStack_70 = (uv_pipe_t *)0x1630a0;
    send_handle_and_close_cold_3();
  }
  puStack_70 = (uv_pipe_t *)ipc_helper_bind_twice;
  send_handle_and_close_cold_4();
  puStack_98 = (uv_pipe_t *)0x1630c0;
  puStack_70 = puVar7;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_80);
  if (iVar1 == 0) {
    puStack_98 = (uv_pipe_t *)0x1630cd;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x1630e1;
    iVar1 = uv_pipe_init(uVar4,&channel,1);
    if (iVar1 != 0) goto LAB_0016326a;
    puVar7 = &channel;
    puStack_98 = (uv_pipe_t *)0x1630fa;
    uv_pipe_open(&channel,0);
    puStack_98 = (uv_pipe_t *)0x163102;
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_0016326f;
    puStack_98 = (uv_pipe_t *)0x163117;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163274;
    puStack_98 = (uv_pipe_t *)0x16312c;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00163279;
    puStack_98 = (uv_pipe_t *)0x163145;
    auStack_90 = uv_buf_init("hello\n",6);
    puStack_98 = (uv_pipe_t *)0x163153;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163162;
    iVar1 = uv_tcp_init(uVar4,&tcp_server);
    if (iVar1 != 0) goto LAB_0016327e;
    puStack_98 = (uv_pipe_t *)0x16316f;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x16317e;
    iVar1 = uv_tcp_init(uVar4,&tcp_server2);
    if (iVar1 != 0) goto LAB_00163283;
    puStack_98 = (uv_pipe_t *)0x163199;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_80,0);
    if (iVar1 != 0) goto LAB_00163288;
    puStack_98 = (uv_pipe_t *)0x1631b4;
    iVar1 = uv_tcp_bind(&tcp_server2,auStack_80,0);
    if (iVar1 != 0) goto LAB_0016328d;
    puStack_98 = (uv_pipe_t *)0x1631e1;
    iVar1 = uv_write2(&write_req,&channel,auStack_90,1,&tcp_server,0);
    if (iVar1 != 0) goto LAB_00163292;
    puStack_98 = (uv_pipe_t *)0x16320e;
    iVar1 = uv_write2(&write_req2,&channel,auStack_90,1,&tcp_server2,0);
    if (iVar1 != 0) goto LAB_00163297;
    puStack_98 = (uv_pipe_t *)0x16321b;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163225;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_0016329c;
    puStack_98 = (uv_pipe_t *)0x16322e;
    puVar7 = (uv_pipe_t *)uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163242;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_98 = (uv_pipe_t *)0x16324c;
    uv_run(puVar7,0);
    puStack_98 = (uv_pipe_t *)0x163251;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163259;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_98 = (uv_pipe_t *)0x16326a;
    ipc_helper_bind_twice_cold_1();
LAB_0016326a:
    puStack_98 = (uv_pipe_t *)0x16326f;
    ipc_helper_bind_twice_cold_2();
LAB_0016326f:
    puStack_98 = (uv_pipe_t *)0x163274;
    ipc_helper_bind_twice_cold_3();
LAB_00163274:
    puStack_98 = (uv_pipe_t *)0x163279;
    ipc_helper_bind_twice_cold_4();
LAB_00163279:
    puStack_98 = (uv_pipe_t *)0x16327e;
    ipc_helper_bind_twice_cold_5();
LAB_0016327e:
    puStack_98 = (uv_pipe_t *)0x163283;
    ipc_helper_bind_twice_cold_6();
LAB_00163283:
    puStack_98 = (uv_pipe_t *)0x163288;
    ipc_helper_bind_twice_cold_7();
LAB_00163288:
    puStack_98 = (uv_pipe_t *)0x16328d;
    ipc_helper_bind_twice_cold_8();
LAB_0016328d:
    puStack_98 = (uv_pipe_t *)0x163292;
    ipc_helper_bind_twice_cold_9();
LAB_00163292:
    puStack_98 = (uv_pipe_t *)0x163297;
    ipc_helper_bind_twice_cold_10();
LAB_00163297:
    puStack_98 = (uv_pipe_t *)0x16329c;
    ipc_helper_bind_twice_cold_11();
LAB_0016329c:
    puStack_98 = (uv_pipe_t *)0x1632a1;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_98 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  puStack_98 = puVar7;
  auStack_a8 = uv_buf_init(0,0);
  uVar4 = uv_default_loop();
  puVar6 = &channel;
  iVar1 = uv_pipe_init(uVar4,&channel,0);
  if (iVar1 == 0) {
    puVar6 = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_001633a9;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_001633ae;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_001633b3;
    puVar6 = &channel;
    iVar1 = uv_write(&write_req,&channel,auStack_a8,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_001633b8;
    uVar4 = uv_default_loop();
    puVar6 = (uv_pipe_t *)0x0;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 0) goto LAB_001633bd;
    if (send_zero_write == 1) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      puVar6 = (uv_pipe_t *)0x0;
      uv_run(uVar4);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001633c7;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_001633a9:
    ipc_helper_send_zero_cold_2();
LAB_001633ae:
    ipc_helper_send_zero_cold_3();
LAB_001633b3:
    ipc_helper_send_zero_cold_4();
LAB_001633b8:
    ipc_helper_send_zero_cold_5();
LAB_001633bd:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_001633c7:
  ipc_helper_send_zero_cold_8();
  if ((int)puVar6 != 0) {
    send_zero_write_cb_cold_1();
    pvVar5 = malloc((size_t)puVar6);
    *extraout_RDX = pvVar5;
    extraout_RDX[1] = puVar6;
    return;
  }
  send_zero_write = send_zero_write + 1;
  return;
}

Assistant:

static void ipc_on_connection_tcp_conn(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;
  uv_tcp_t* conn;

  ASSERT(status == 0);
  ASSERT((uv_stream_t*)&tcp_server == server);

  conn = malloc(sizeof(*conn));
  ASSERT(conn);

  r = uv_tcp_init(server->loop, conn);
  ASSERT(r == 0);

  r = uv_accept(server, (uv_stream_t*)conn);
  ASSERT(r == 0);

  /* Send the accepted connection to the other process */
  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
    (uv_stream_t*)conn, NULL);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) conn,
                    on_read_alloc,
                    on_tcp_child_process_read);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)conn, close_cb);
}